

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O2

void __thiscall Clasp::Asp::LogicProgram::transformExtended(LogicProgram *this)

{
  int *piVar1;
  size_type sVar2;
  RuleBuilder *this_00;
  bool bVar3;
  LogicProgram *this_01;
  size_type i;
  uint uVar4;
  RuleTransform tm;
  Lit_t auxB;
  Atom_t aux;
  Rule local_e8;
  LitSpan local_b0;
  Rule r;
  Rule rAux2;
  
  sVar2 = (this->atoms_).ebo_.size;
  RuleTransform::RuleTransform(&tm,this);
  for (uVar4 = 0; uVar4 != (this->extended_).ebo_.size; uVar4 = uVar4 + 1) {
    Potassco::RuleBuilder::rule(&r,(this->extended_).ebo_.buf[uVar4]);
    piVar1 = (int *)(&(this->super_ProgramBuilder).field_0x1c +
                    (ulong)r.ht.val_ * 4 + (long)this->statsId_ * 0x14);
    *piVar1 = *piVar1 + -1;
    *(int *)(&this->field_0x44 + (ulong)r.bt.val_ * 4 + (long)this->statsId_ * 0xc) =
         *(int *)(&this->field_0x44 + (ulong)r.bt.val_ * 4 + (long)this->statsId_ * 0xc) + -1;
    if (((ulong)r.bt.val_ == 0) || ((r.ht.val_ == Disjunctive && (r.head.size < 2)))) {
      RuleTransform::transform(&tm,&r,strategy_default);
    }
    else {
      auxB = newAtom(this);
      local_e8.field_3._16_8_ = r.field_3._16_8_;
      local_e8.field_3.cond.first = r.field_3.cond.first;
      local_e8.field_3.cond.size = r.field_3.cond.size;
      local_e8._0_8_ = (ulong)(uint)r._4_4_ << 0x20;
      local_e8.head.first = &aux;
      local_e8.head.size = 1;
      local_b0.first = &auxB;
      local_b0.size = 1;
      aux = auxB;
      Potassco::Rule_t::normal(&rAux2,r.ht,&r.head,&local_b0);
      this_01 = this;
      bVar3 = handleNatively(this,&local_e8);
      if (bVar3) {
        addRule(this,&local_e8);
      }
      else {
        bVar3 = transformNoAux(this_01,&local_e8);
        RuleTransform::transform(&tm,&local_e8,(uint)bVar3);
      }
      bVar3 = handleNatively(this,&rAux2);
      if (bVar3) {
        addRule(this,&rAux2);
      }
      else {
        RuleTransform::transform(&tm,&rAux2,strategy_default);
      }
    }
    this_00 = (this->extended_).ebo_.buf[uVar4];
    if (this_00 != (RuleBuilder *)0x0) {
      Potassco::RuleBuilder::~RuleBuilder(this_00);
    }
    operator_delete(this_00);
  }
  (this->extended_).ebo_.size = 0;
  *(size_type *)&this->field_0x60 = *(int *)&this->field_0x60 + ((this->atoms_).ebo_.size - sVar2);
  RuleTransform::~RuleTransform(&tm);
  return;
}

Assistant:

void LogicProgram::transformExtended() {
	uint32 a = numAtoms();
	RuleTransform tm(*this);
	for (RuleList::size_type i = 0; i != extended_.size(); ++i) {
		Rule r = extended_[i]->rule();
		upStat(r.ht, -1);
		upStat(r.bt, -1);
		if (r.normal() || (r.ht == Head_t::Disjunctive && Potassco::size(r.head) < 2)) {
			tm.transform(r);
		}
		else {
			using Potassco::Lit_t;
			Atom_t aux = newAtom();
			Lit_t auxB = Potassco::lit(aux);
			Rule rAux1 = r; // aux :- body
			rAux1.ht   = Head_t::Disjunctive;
			rAux1.head = Potassco::toSpan(&aux, 1);
			Rule rAux2 = Rule::normal(r.ht, r.head, Potassco::toSpan(&auxB, 1));  // head :- auxB
			if (handleNatively(rAux1)) { addRule(rAux1); }
			else {
				RuleTransform::Strategy st = transformNoAux(rAux1) ? RuleTransform::strategy_no_aux : RuleTransform::strategy_default;
				tm.transform(rAux1, st);
			}
			if (handleNatively(rAux2)) { addRule(rAux2); }
			else                       { tm.transform(rAux2); }
		}
		delete extended_[i];
	}
	extended_.clear();
	incTrAux(numAtoms() - a);
}